

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O3

uint64_t GetCombinedEntropy(uint32_t *X,uint32_t *Y,int length,int is_X_used,int is_Y_used,
                           int trivial_at_end)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  VP8LStreaks stats;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks local_30;
  VP8LBitEntropy local_18;
  
  if (trivial_at_end != 0) {
    return (ulong)(length * 0xf0 + 0x1270) * 0x2000 + 0x17f33333;
  }
  if (is_X_used == 0) {
    X = Y;
    if (is_Y_used != 0) goto LAB_00148e63;
    local_30.counts[1] = 0;
    local_30.streaks[0][0] = 0;
    local_30.streaks[0][1] = 0;
    local_30.streaks[1][0] = 0;
    local_30.streaks[1][1] = 0;
    local_30.counts[0] = 1;
    local_30.streaks[0][3 < length] = length;
    VP8LBitEntropyInit(&local_18);
  }
  else if (is_Y_used == 0) {
LAB_00148e63:
    (*VP8LGetEntropyUnrefined)(X,length,&local_18,&local_30);
  }
  else {
    (*VP8LGetCombinedEntropyUnrefined)(X,Y,length,&local_18,&local_30);
  }
  lVar1 = 0x273;
  if (local_18.nonzeros < 5) {
    if (local_18.nonzeros < 2) {
      uVar4 = 0;
      goto LAB_00148f76;
    }
    if (local_18.nonzeros == 3) {
      lVar1 = 0x3b6;
    }
    else {
      if (local_18.nonzeros == 2) {
        lVar2 = (ulong)local_18.sum * 0x31800000;
        lVar1 = lVar2 + local_18.entropy + 0x32;
        if ((long)(lVar2 + local_18.entropy) < 0) {
          lVar1 = lVar2 + local_18.entropy + -0x32;
        }
        uVar4 = lVar1 / 100;
        goto LAB_00148f76;
      }
      lVar1 = 700;
    }
  }
  lVar2 = (ulong)(local_18.sum * 2 - local_18.max_val) * lVar1 * 0x800000;
  lVar3 = (1000 - lVar1) * local_18.entropy;
  lVar1 = lVar2 + lVar3 + 500;
  if (lVar2 + lVar3 < 0) {
    lVar1 = lVar2 + lVar3 + -500;
  }
  uVar4 = lVar1 / 1000;
  if ((ulong)(lVar1 / 1000) < local_18.entropy) {
    uVar4 = local_18.entropy;
  }
LAB_00148f76:
  return uVar4 + (ulong)(uint)(local_30.streaks[1][0] * 0xd20 + local_30.streaks[0][0] * 0x730 +
                              local_30.streaks[1][1] * 0x2d0 + local_30.counts[1] * 0xa50 +
                              local_30.streaks[0][1] * 0xf0 + local_30.counts[0] * 0x640) * 0x2000 +
         0x17f33333;
}

Assistant:

static WEBP_INLINE uint64_t GetCombinedEntropy(const uint32_t* const X,
                                               const uint32_t* const Y,
                                               int length, int is_X_used,
                                               int is_Y_used,
                                               int trivial_at_end) {
  VP8LStreaks stats;
  if (trivial_at_end) {
    // This configuration is due to palettization that transforms an indexed
    // pixel into 0xff000000 | (pixel << 8) in VP8LBundleColorMap.
    // BitsEntropyRefine is 0 for histograms with only one non-zero value.
    // Only FinalHuffmanCost needs to be evaluated.
    memset(&stats, 0, sizeof(stats));
    // Deal with the non-zero value at index 0 or length-1.
    stats.streaks[1][0] = 1;
    // Deal with the following/previous zero streak.
    stats.counts[0] = 1;
    stats.streaks[0][1] = length - 1;
    return FinalHuffmanCost(&stats);
  } else {
    VP8LBitEntropy bit_entropy;
    if (is_X_used) {
      if (is_Y_used) {
        VP8LGetCombinedEntropyUnrefined(X, Y, length, &bit_entropy, &stats);
      } else {
        VP8LGetEntropyUnrefined(X, length, &bit_entropy, &stats);
      }
    } else {
      if (is_Y_used) {
        VP8LGetEntropyUnrefined(Y, length, &bit_entropy, &stats);
      } else {
        memset(&stats, 0, sizeof(stats));
        stats.counts[0] = 1;
        stats.streaks[0][length > 3] = length;
        VP8LBitEntropyInit(&bit_entropy);
      }
    }

    return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
  }
}